

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall MarrayTest::copyConstructorTest<false>(MarrayTest *this)

{
  int *data;
  int iVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  undefined8 *puVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_09;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_04;
  size_t sVar3;
  size_t sVar4;
  reference piVar5;
  int x;
  int iVar6;
  int iVar7;
  int y;
  int x_5;
  int *piVar8;
  int x_10;
  int x_1;
  int z_2;
  allocator_type local_109;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> strides;
  Marray<int,_std::allocator<unsigned_long>_> m;
  Marray<int,_std::allocator<unsigned_long>_> n;
  
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&m,(allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&m,&this->scalar_,&andres::defaultOrder,(allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,&m);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = sVar3 == sVar4;
  test((bool *)&shape);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
       n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
  test((bool *)&shape);
  piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
  iVar6 = *piVar5;
  piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = iVar6 == *piVar5;
  test((bool *)&shape);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  begin._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 0x18;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,&m);
  if (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar3 == sVar4;
  }
  else {
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&strides);
  for (iVar6 = 0; iVar6 != 0x18; iVar6 = iVar6 + 1) {
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar6);
    iVar7 = *piVar5;
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,iVar6);
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar7 == *piVar5;
    test((bool *)&strides);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  begin_00._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 6;
  begin_00._M_current[1] = 4;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,&m);
  if (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar3 == sVar4;
  }
  else {
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&strides);
  for (sVar3 = 0; sVar3 != 6; sVar3 = sVar3 + 1) {
    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar3,iVar6);
      iVar7 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar3,iVar6);
      strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = iVar7 == *piVar5;
      test((bool *)&strides);
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  begin_01._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 3;
  begin_01._M_current[1] = 4;
  begin_01._M_current[2] = 2;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray(&n,&m);
  if (m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar3 == sVar4;
  }
  else {
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&strides);
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
      for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar3,iVar6,iVar7);
        iVar1 = *piVar5;
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar3,iVar6,iVar7);
        strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = iVar1 == *piVar5;
        test((bool *)&strides);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&n);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>,&this->scalar_,
             (allocator_type *)&m);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    if (sVar3 != sVar4) goto LAB_001900a6;
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
    iVar6 = *piVar5;
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar6 == *piVar5;
  }
  else {
LAB_001900a6:
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  begin_02._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_02._M_current = 0x18;
  data = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&n,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar3 == sVar4;
  }
  else {
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&strides);
  for (iVar6 = 0; iVar6 != 0x18; iVar6 = iVar6 + 1) {
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,iVar6);
    iVar7 = *piVar5;
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar6);
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar7 == *piVar5;
    test((bool *)&strides);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  *(undefined8 *)
   CONCAT71(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._1_7_,
            shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_) = 6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&strides,1,(allocator_type *)&m);
  it._M_current._1_7_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  it._M_current._0_1_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *it._M_current = 4;
  begin_03._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  m.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_4_ = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&n,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,it,data,(CoordinateOrder *)&m,&local_109);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  piVar8 = data;
  for (iVar6 = 0; iVar6 != 6; iVar6 = iVar6 + 1) {
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar6);
    local_109 = (allocator_type)(*piVar5 == *piVar8);
    test((bool *)&local_109);
    piVar8 = piVar8 + 4;
  }
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (sVar3 == sVar4) {
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
    iVar6 = *piVar5;
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    if (iVar6 != *piVar5) goto LAB_001902d7;
    local_109 = (allocator_type)
                (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
                m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_);
  }
  else {
LAB_001902d7:
    local_109 = (allocator_type)0x0;
  }
  test((bool *)&local_109);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&m);
  *(undefined8 *)
   CONCAT71(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._1_7_,
            shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_) = 6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&strides,1,(allocator_type *)&m);
  it_00._M_current._1_7_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  it_00._M_current._0_1_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *it_00._M_current = 4;
  begin_04._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  piVar8 = this->data_ + 2;
  m.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_4_ = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&n,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,it_00,piVar8,(CoordinateOrder *)&m,&local_109);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  for (iVar6 = 0; iVar6 != 6; iVar6 = iVar6 + 1) {
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,iVar6);
    local_109 = (allocator_type)(*piVar5 == *piVar8);
    test((bool *)&local_109);
    piVar8 = piVar8 + 4;
  }
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (sVar3 == sVar4) {
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
    iVar6 = *piVar5;
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    if (iVar6 != *piVar5) goto LAB_00190420;
    local_109 = (allocator_type)
                (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
                m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_);
  }
  else {
LAB_00190420:
    local_109 = (allocator_type)0x0;
  }
  test((bool *)&local_109);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  begin_05._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 6;
  begin_05._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&n,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar3 == sVar4;
  }
  else {
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&strides);
  for (sVar3 = 0; sVar3 != 6; sVar3 = sVar3 + 1) {
    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar3,iVar6);
      iVar7 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar3,iVar6);
      strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = iVar7 == *piVar5;
      test((bool *)&strides);
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *(undefined8 *)
   CONCAT71(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._1_7_,
            shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_) = 3;
  ((undefined8 *)
  CONCAT71(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._1_7_,
           shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_1_))[1] = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&strides,2,(allocator_type *)&m);
  it_01._M_current._1_7_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  it_01._M_current._0_1_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *it_01._M_current = 1;
  it_01._M_current[1] = 3;
  begin_06._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  m.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_4_ = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&n,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,it_01,data,(CoordinateOrder *)&m,&local_109);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
    for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar3,iVar6);
      iVar7 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar3,iVar6);
      local_109 = (allocator_type)(iVar7 == *piVar5);
      test((bool *)&local_109);
    }
  }
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (sVar3 == sVar4) {
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
    iVar6 = *piVar5;
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    if (iVar6 != *piVar5) goto LAB_001906b6;
    local_109 = (allocator_type)
                (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
                m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_);
  }
  else {
LAB_001906b6:
    local_109 = (allocator_type)0x0;
  }
  test((bool *)&local_109);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *(undefined8 *)
   CONCAT71(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._1_7_,
            shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_) = 3;
  ((undefined8 *)
  CONCAT71(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._1_7_,
           shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_1_))[1] = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&strides,2,(allocator_type *)&m);
  it_02._M_current._1_7_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  it_02._M_current._0_1_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *it_02._M_current = 1;
  it_02._M_current[1] = 3;
  begin_07._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  m.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_4_ = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&n,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,it_02,this->data100_ + 0x32,(CoordinateOrder *)&m,
             &local_109);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
    for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar3,iVar6);
      iVar7 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar3,iVar6);
      local_109 = (allocator_type)(iVar7 == *piVar5);
      test((bool *)&local_109);
    }
  }
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (sVar3 == sVar4) {
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&n,0);
    iVar6 = *piVar5;
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&m,0);
    if (iVar6 == *piVar5) {
      local_109 = (allocator_type)
                  (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
                  m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_);
      goto LAB_0019084f;
    }
  }
  local_109 = (allocator_type)0x0;
LAB_0019084f:
  test((bool *)&local_109);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  begin_08._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_08._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_08._M_current = 3;
  begin_08._M_current[1] = 4;
  begin_08._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&n,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar3 == sVar4;
  }
  else {
    strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&strides);
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
      for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar3,iVar6,iVar7);
        iVar1 = *piVar5;
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar3,iVar6,iVar7);
        strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = iVar1 == *piVar5;
        test((bool *)&strides);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  puVar2 = (undefined8 *)
           CONCAT71(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start._1_7_,
                    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start._0_1_);
  *puVar2 = 3;
  puVar2[1] = 4;
  puVar2[2] = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&strides,3,(allocator_type *)&m);
  it_03._M_current._1_7_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  it_03._M_current._0_1_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *it_03._M_current = 2;
  it_03._M_current[1] = 10;
  it_03._M_current[2] = 0x23;
  begin_09._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_09._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  m.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_4_ = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&n,begin_09,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,it_03,this->data100_,(CoordinateOrder *)&m,
             &local_109);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    local_109 = (allocator_type)(sVar3 == sVar4);
  }
  else {
    local_109 = (allocator_type)0x0;
  }
  test((bool *)&local_109);
  for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar3,iVar7,iVar6);
        iVar1 = *piVar5;
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar3,iVar7,iVar6);
        local_109 = (allocator_type)(iVar1 == *piVar5);
        test((bool *)&local_109);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  puVar2 = (undefined8 *)
           CONCAT71(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start._1_7_,
                    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start._0_1_);
  *puVar2 = 3;
  puVar2[1] = 4;
  puVar2[2] = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&strides,3,(allocator_type *)&m);
  it_04._M_current._1_7_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  it_04._M_current._0_1_ =
       strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *it_04._M_current = 2;
  it_04._M_current[1] = 10;
  it_04._M_current[2] = 0x23;
  begin_10._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_10._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  m.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_4_ = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&n,begin_10,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,it_04,this->data100_ + 0x1e,(CoordinateOrder *)&m,
             &local_109);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             &n.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
      m.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_) {
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&n.super_View<int,_false,_std::allocator<unsigned_long>_>);
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>);
    local_109 = (allocator_type)(sVar3 == sVar4);
  }
  else {
    local_109 = (allocator_type)0x0;
  }
  test((bool *)&local_109);
  for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&n,sVar3,iVar7,iVar6);
        iVar1 = *piVar5;
        piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&m,sVar3,iVar7,iVar6);
        local_109 = (allocator_type)(iVar1 == *piVar5);
        test((bool *)&local_109);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&n.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void MarrayTest::copyConstructorTest() {
    // contruction from a Marray
    {
        // empty 
        {
            andres::Marray<int> m;
            andres::Marray<int> n(m);
        }
        // scalar
        {
            andres::Marray<int> m(scalar_);
            andres::Marray<int> n(m);

            test(m.dimension() == n.dimension());
            test(m.size() == n.size());
            test(m(0) == n(0));
        }
        // 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 24; ++x)
                test(m(x)==n(x));
        }
        // 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 6; ++x){
                for(int y = 0; y < 4; ++y)
                    test(m(x, y)==n(x, y));
            }
        }
        // 3D 
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 3; ++x){
                for(int y = 0; y < 4; ++y){
                    for(int z = 0; z < 2; ++z)
                        test(m(x, y, z)==n(x, y, z));
                }
            }
        }
    }
    // contruction from a view
    {
        // scalar
        {
            andres::View<int, constTarget> v(&scalar_);
            andres::Marray<int> m(v);
            test(v.size()==m.size() &&
                   v.dimension()==m.dimension() &&
                   v(0)==m(0));
        }
        // View is 1D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);
                
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
            // with strides and without offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 6;
                std::vector<std::size_t> strides(1);
                strides[0] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(),
                    strides.begin(), data_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                int i = 0; 
                for(int x = 0; x < 6; ++x){
                    test(m(x) == data_[i]);
                    i+=4;
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
            // with strides and offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 6;
                std::vector<std::size_t> strides(1);
                strides[0] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(),
                    strides.begin(), data_+2, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                int i = 2; 
                for(int x = 0; x < 6; ++x){
                    test(m(x) == data_[i]);
                    i+=4;
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
        }
        // View is 2D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
            // with strides and without offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 3;
                shape[1] = 2;
                std::vector<std::size_t> strides(2);
                strides[0] = 1;
                strides[1] = 3;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(), data_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y)==m(x, y));
                    }
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
            // with strides and offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 3;
                shape[1] = 2;
                std::vector<std::size_t> strides(2);
                strides[0] = 1;
                strides[1] = 3;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_+50, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y)==m(x, y));
                    }
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
        }
        // View is 3D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 3; ++x)
                for(int y = 0; y < 4; ++y)
                for(int z = 0; z < 2; ++z){
                    test(v(x, y, z)==m(x, y, z));
                    
                }
            }
            // with strides and without offset
            {        
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                std::vector<std::size_t> strides(3);
                strides[0] = 2;
                strides[1] = 10;
                strides[2] = 35;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int z = 0; z < 2; ++z)
                for(int y = 0; y < 4; ++y)
                for(int x = 0; x < 3; ++x){
                    test(v(x, y, z)==m(x, y, z));
                }
            }
            // with strides and offset
            {       
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                std::vector<std::size_t> strides(3);
                strides[0] = 2;
                strides[1] = 10;
                strides[2] = 35;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_+30, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int z = 0; z < 2; ++z)
                for(int y = 0; y < 4; ++y)
                for(int x = 0; x < 3; ++x){
                    test(v(x, y, z)==m(x, y, z));
                }
            }
        }
    }
}